

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O1

double * __thiscall ON_MorphControl::Knot(ON_MorphControl *this,int dir)

{
  int iVar1;
  
  iVar1 = this->m_varient;
  if (iVar1 == 3) {
    if ((uint)dir < 3) {
      return (this->m_nurbs_cage).m_knot[(uint)dir];
    }
  }
  else if (iVar1 == 2) {
    if ((uint)dir < 2) {
      return (this->m_nurbs_surface).m_knot[(uint)dir];
    }
  }
  else if ((iVar1 == 1) && (dir == 0)) {
    return (this->m_nurbs_curve).m_knot;
  }
  return (double *)0x0;
}

Assistant:

const double* ON_MorphControl::Knot(int dir) const
{
  const double* knot = 0;

  switch(m_varient)
  {
  case 1:
    knot = (0 == dir) ? m_nurbs_curve.m_knot : 0;
    break;
  case 2:
    knot = (0 == dir || 1 == dir) ? m_nurbs_surface.m_knot[dir] : 0;
    break;
  case 3:
    knot = (0 <= dir && dir <= 2) ? m_nurbs_cage.m_knot[dir] : 0;
    break;
  }

  return knot;
}